

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

int Gia_ManComputeOverlapOne(Gia_Man_t *p,int iObj)

{
  int iVar1;
  int *piVar2;
  int local_1c;
  int k;
  int iFan;
  int iObj_local;
  Gia_Man_t *p_local;
  
  Gia_ManIncrementTravId(p);
  for (local_1c = 0; iVar1 = Gia_ObjLutSize(p,iObj), local_1c < iVar1; local_1c = local_1c + 1) {
    piVar2 = Gia_ObjLutFanins(p,iObj);
    Gia_ObjSetTravIdCurrentId(p,piVar2[local_1c]);
  }
  iVar1 = Gia_ManComputeOverlapOne_rec(p,iObj);
  return iVar1;
}

Assistant:

int Gia_ManComputeOverlapOne( Gia_Man_t * p, int iObj )
{
    int iFan, k;
    Gia_ManIncrementTravId(p);
    Gia_LutForEachFanin( p, iObj, iFan, k )
        Gia_ObjSetTravIdCurrentId( p, iFan );
    return Gia_ManComputeOverlapOne_rec( p, iObj );
}